

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControl.cpp
# Opt level: O2

void __thiscall
Rml::ElementFormControl::OnAttributeChange
          (ElementFormControl *this,ElementAttributes *changed_attributes)

{
  bool activate;
  const_iterator cVar1;
  allocator<char> local_69;
  Property local_68;
  
  Element::OnAttributeChange(&this->super_Element,changed_attributes);
  cVar1 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[9]>(changed_attributes,(char (*) [9])"disabled");
  if (cVar1._M_current !=
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    activate = IsDisabled(this);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"disabled",&local_69);
    Element::SetPseudoClass(&this->super_Element,(String *)&local_68,activate);
    ::std::__cxx11::string::~string((string *)&local_68);
    if (activate) {
      Property::Property<Rml::Style::Focus,Rml::Style::Focus>(&local_68,None);
      Element::SetProperty(&this->super_Element,Focus,&local_68);
      Property::~Property(&local_68);
      Element::Blur(&this->super_Element);
    }
    else {
      Element::RemoveProperty(&this->super_Element,Focus);
    }
  }
  return;
}

Assistant:

void ElementFormControl::OnAttributeChange(const ElementAttributes& changed_attributes)
{
	Element::OnAttributeChange(changed_attributes);

	if (changed_attributes.find("disabled") != changed_attributes.end())
	{
		bool is_disabled = IsDisabled();
		SetPseudoClass("disabled", is_disabled);

		// Disable focus when element is disabled. This will also prevent click
		// events (when originating from user inputs, see Context) to reach the element.
		if (is_disabled)
		{
			SetProperty(PropertyId::Focus, Property(Style::Focus::None));
			Blur();
		}
		else
			RemoveProperty(PropertyId::Focus);
	}
}